

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256_64.h
# Opt level: O2

void fiat_p256_square(uint64_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  
  iVar37 = CRYPTO_is_BMI1_capable();
  if (iVar37 != 0) {
    iVar37 = CRYPTO_is_BMI2_capable();
    if (iVar37 != 0) {
      iVar37 = CRYPTO_is_ADX_capable();
      if (iVar37 != 0) {
        fiat_p256_adx_sqr(out1,arg1);
        return;
      }
    }
  }
  uVar1 = *arg1;
  uVar61 = arg1[1];
  uVar48 = arg1[2];
  uVar49 = arg1[3];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar49;
  auVar2 = auVar2 * auVar24;
  uVar50 = auVar2._8_8_;
  uVar38 = auVar2._0_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar1;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar48;
  auVar3 = auVar3 * auVar25;
  uVar51 = auVar3._8_8_;
  uVar39 = auVar3._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar61;
  auVar4 = auVar4 * auVar26;
  uVar52 = auVar4._8_8_;
  uVar40 = auVar4._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar1;
  uVar53 = SUB168(auVar5 * auVar27,8);
  uVar41 = SUB168(auVar5 * auVar27,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar41;
  uVar54 = SUB168(auVar6 * ZEXT816(0xffffffff00000001),8);
  uVar42 = SUB168(auVar6 * ZEXT816(0xffffffff00000001),0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar41;
  uVar55 = SUB168(auVar7 * ZEXT816(0xffffffff),8);
  uVar43 = SUB168(auVar7 * ZEXT816(0xffffffff),0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar41;
  uVar56 = SUB168(auVar8 * ZEXT816(0xffffffffffffffff),8);
  uVar44 = SUB168(auVar8 * ZEXT816(0xffffffffffffffff),0);
  uVar62 = uVar39 + uVar52 + (ulong)CARRY8(uVar53,uVar40);
  uVar1 = (ulong)(CARRY8(uVar39,uVar52) || CARRY8(uVar39 + uVar52,(ulong)CARRY8(uVar53,uVar40)));
  uVar68 = uVar38 + uVar51 + uVar1;
  uVar60 = (ulong)(CARRY8(uVar38,uVar51) || CARRY8(uVar38 + uVar51,uVar1));
  uVar47 = uVar54 + uVar50;
  uVar65 = uVar47 + uVar60;
  uVar1 = (ulong)(CARRY8(uVar53 + uVar40,uVar56 + uVar43) ||
                 CARRY8(uVar53 + uVar40 + uVar56 + uVar43,(ulong)CARRY8(uVar44,uVar41)));
  uVar63 = uVar62 + uVar1;
  uVar69 = uVar68 + uVar42;
  uVar70 = (ulong)CARRY8(uVar68,uVar42);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar49;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar61;
  uVar57 = SUB168(auVar9 * auVar28,8);
  uVar68 = SUB168(auVar9 * auVar28,0);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar48;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar61;
  uVar58 = SUB168(auVar10 * auVar29,8);
  uVar45 = SUB168(auVar10 * auVar29,0);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar61;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar61;
  uVar42 = SUB168(auVar11 * auVar30,8);
  uVar46 = SUB168(auVar11 * auVar30,0);
  uVar61 = uVar42 + uVar45;
  uVar59 = uVar61 + CARRY8(uVar52,uVar46);
  uVar61 = (ulong)(CARRY8(uVar42,uVar45) || CARRY8(uVar61,(ulong)CARRY8(uVar52,uVar46)));
  uVar67 = uVar68 + uVar58 + uVar61;
  uVar66 = uVar57 + (CARRY8(uVar68,uVar58) || CARRY8(uVar68 + uVar58,uVar61));
  uVar61 = uVar63 + uVar55;
  uVar64 = uVar61 + CARRY8(uVar56,uVar43);
  uVar62 = (ulong)CARRY8(uVar62,uVar1);
  uVar61 = (ulong)(CARRY8(uVar63,uVar55) || CARRY8(uVar61,(ulong)CARRY8(uVar56,uVar43)));
  uVar42 = uVar62 + uVar69;
  uVar55 = uVar42 + uVar61;
  uVar1 = uVar53 + uVar40 + (ulong)CARRY8(uVar44,uVar41) + uVar56 + uVar43;
  auVar36._8_8_ = uVar46;
  auVar36._0_8_ = uVar1;
  uVar61 = (ulong)(CARRY8(uVar62,uVar69) || CARRY8(uVar42,uVar61));
  uVar42 = uVar70 + uVar65;
  uVar41 = uVar42 + uVar61;
  uVar53 = (ulong)(CARRY8(uVar54,uVar50) || CARRY8(uVar47,uVar60));
  uVar61 = (ulong)(CARRY8(uVar70,uVar65) || CARRY8(uVar42,uVar61));
  uVar47 = uVar53 + uVar66;
  uVar54 = uVar47 + uVar61;
  lVar71 = SUB168(auVar4 + auVar36,8);
  uVar62 = SUB168(auVar4 + auVar36,0);
  uVar1 = (ulong)(CARRY8(uVar52 + uVar46,uVar64) ||
                 CARRY8(uVar52 + uVar46 + uVar64,(ulong)CARRY8(uVar1,uVar40)));
  uVar60 = uVar55 + uVar59;
  uVar63 = uVar60 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar55,uVar59) || CARRY8(uVar60,uVar1));
  uVar60 = uVar41 + uVar67;
  uVar56 = uVar60 + uVar1;
  uVar60 = (ulong)(CARRY8(uVar41,uVar67) || CARRY8(uVar60,uVar1));
  uVar55 = uVar54 + uVar60;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar62;
  uVar44 = SUB168(auVar12 * ZEXT816(0xffffffff),8);
  uVar40 = SUB168(auVar12 * ZEXT816(0xffffffff),0);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar62;
  uVar46 = SUB168(auVar13 * ZEXT816(0xffffffffffffffff),8);
  uVar41 = SUB168(auVar13 * ZEXT816(0xffffffffffffffff),0);
  uVar1 = lVar71 + uVar64;
  uVar1 = (ulong)(CARRY8(uVar1,uVar46 + uVar40) ||
                 CARRY8(uVar1 + uVar46 + uVar40,(ulong)CARRY8(uVar41,uVar62)));
  uVar65 = uVar63 + uVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar62;
  uVar52 = SUB168(auVar14 * ZEXT816(0xffffffff00000001),8);
  uVar43 = SUB168(auVar14 * ZEXT816(0xffffffff00000001),0);
  uVar42 = uVar65 + uVar44;
  uVar70 = uVar42 + CARRY8(uVar46,uVar40);
  uVar59 = (ulong)CARRY8(uVar63,uVar1);
  uVar1 = (ulong)(CARRY8(uVar65,uVar44) || CARRY8(uVar42,(ulong)CARRY8(uVar46,uVar40)));
  uVar42 = uVar59 + uVar43;
  uVar44 = uVar42 + uVar1;
  uVar63 = uVar44 + uVar56;
  uVar43 = (ulong)(CARRY8(uVar59,uVar43) || CARRY8(uVar42,uVar1));
  uVar1 = (ulong)CARRY8(uVar44,uVar56);
  uVar42 = uVar43 + uVar52;
  uVar44 = uVar42 + uVar1;
  uVar56 = uVar44 + uVar55;
  uVar53 = (ulong)(CARRY8(uVar53,uVar66) || CARRY8(uVar47,uVar61)) +
           (ulong)(CARRY8(uVar43,uVar52) || CARRY8(uVar42,uVar1)) + (ulong)CARRY8(uVar44,uVar55) +
           (ulong)CARRY8(uVar54,uVar60);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar49;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar48;
  uVar43 = SUB168(auVar15 * auVar31,8);
  uVar47 = SUB168(auVar15 * auVar31,0);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar48;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar48;
  uVar60 = SUB168(auVar16 * auVar32,8);
  uVar48 = SUB168(auVar16 * auVar32,0);
  uVar61 = uVar48 + uVar58;
  uVar44 = uVar61 + CARRY8(uVar51,uVar45);
  uVar1 = lVar71 + uVar64 + (ulong)CARRY8(uVar41,uVar62) + uVar46 + uVar40;
  auVar35._8_8_ = uVar45;
  auVar35._0_8_ = uVar1;
  uVar61 = (ulong)(CARRY8(uVar48,uVar58) || CARRY8(uVar61,(ulong)CARRY8(uVar51,uVar45)));
  uVar48 = uVar60 + uVar47;
  uVar42 = uVar48 + uVar61;
  uVar54 = uVar43 + (CARRY8(uVar60,uVar47) || CARRY8(uVar48,uVar61));
  lVar71 = SUB168(auVar3 + auVar35,8);
  uVar52 = SUB168(auVar3 + auVar35,0);
  uVar1 = (ulong)(CARRY8(uVar51 + uVar45,uVar70) ||
                 CARRY8(uVar51 + uVar45 + uVar70,(ulong)CARRY8(uVar1,uVar39)));
  uVar61 = uVar44 + uVar63;
  uVar55 = uVar61 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar44,uVar63) || CARRY8(uVar61,uVar1));
  uVar61 = uVar42 + uVar56;
  uVar46 = uVar61 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar42,uVar56) || CARRY8(uVar61,uVar1));
  uVar48 = uVar54 + uVar53;
  uVar51 = uVar48 + uVar1;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar52;
  uVar41 = SUB168(auVar17 * ZEXT816(0xffffffff),8);
  uVar42 = SUB168(auVar17 * ZEXT816(0xffffffff),0);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar52;
  uVar44 = SUB168(auVar18 * ZEXT816(0xffffffffffffffff),8);
  uVar39 = SUB168(auVar18 * ZEXT816(0xffffffffffffffff),0);
  uVar61 = lVar71 + uVar70;
  uVar61 = (ulong)(CARRY8(uVar61,uVar44 + uVar42) ||
                  CARRY8(uVar61 + uVar44 + uVar42,(ulong)CARRY8(uVar39,uVar52)));
  uVar56 = uVar55 + uVar61;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar52;
  uVar45 = SUB168(auVar19 * ZEXT816(0xffffffff00000001),8);
  uVar40 = SUB168(auVar19 * ZEXT816(0xffffffff00000001),0);
  uVar60 = uVar56 + uVar41;
  uVar58 = uVar60 + CARRY8(uVar44,uVar42);
  uVar55 = (ulong)CARRY8(uVar55,uVar61);
  uVar61 = (ulong)(CARRY8(uVar56,uVar41) || CARRY8(uVar60,(ulong)CARRY8(uVar44,uVar42)));
  uVar60 = uVar55 + uVar40;
  uVar41 = uVar60 + uVar61;
  uVar56 = uVar41 + uVar46;
  uVar40 = (ulong)(CARRY8(uVar55,uVar40) || CARRY8(uVar60,uVar61));
  uVar61 = (ulong)CARRY8(uVar41,uVar46);
  uVar60 = uVar40 + uVar45;
  uVar41 = uVar60 + uVar61;
  uVar46 = uVar41 + uVar51;
  uVar40 = (ulong)(CARRY8(uVar40,uVar45) || CARRY8(uVar60,uVar61)) + (ulong)CARRY8(uVar41,uVar51) +
           (ulong)(CARRY8(uVar54,uVar53) || CARRY8(uVar48,uVar1));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar49;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar49;
  uVar49 = SUB168(auVar20 * auVar33,0);
  uVar41 = uVar47 + uVar57 + (ulong)CARRY8(uVar50,uVar68);
  uVar61 = (ulong)(CARRY8(uVar47,uVar57) || CARRY8(uVar47 + uVar57,(ulong)CARRY8(uVar50,uVar68)));
  uVar48 = uVar49 + uVar43;
  uVar60 = uVar48 + uVar61;
  uVar1 = lVar71 + uVar70 + (ulong)CARRY8(uVar39,uVar52) + uVar44 + uVar42;
  auVar34._8_8_ = uVar68;
  auVar34._0_8_ = uVar1;
  uVar45 = SUB168(auVar20 * auVar33,8) + (ulong)(CARRY8(uVar49,uVar43) || CARRY8(uVar48,uVar61));
  lVar71 = SUB168(auVar2 + auVar34,8);
  uVar51 = SUB168(auVar2 + auVar34,0);
  uVar1 = (ulong)(CARRY8(uVar50 + uVar68,uVar58) ||
                 CARRY8(uVar50 + uVar68 + uVar58,(ulong)CARRY8(uVar1,uVar38)));
  uVar61 = uVar41 + uVar56;
  uVar38 = uVar61 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar41,uVar56) || CARRY8(uVar61,uVar1));
  uVar61 = uVar60 + uVar46;
  uVar50 = uVar61 + uVar1;
  uVar61 = (ulong)(CARRY8(uVar60,uVar46) || CARRY8(uVar61,uVar1));
  uVar48 = uVar45 + uVar40;
  uVar68 = uVar48 + uVar61;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar51;
  uVar49 = SUB168(auVar21 * ZEXT816(0xffffffff),8);
  uVar60 = SUB168(auVar21 * ZEXT816(0xffffffff),0);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar51;
  uVar43 = SUB168(auVar22 * ZEXT816(0xffffffffffffffff),8);
  uVar47 = SUB168(auVar22 * ZEXT816(0xffffffffffffffff),0);
  uVar1 = lVar71 + uVar58;
  uVar1 = (ulong)(CARRY8(uVar1,uVar43 + uVar60) ||
                 CARRY8(uVar1 + uVar43 + uVar60,(ulong)CARRY8(uVar47,uVar51)));
  uVar39 = uVar38 + uVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar51;
  uVar44 = SUB168(auVar23 * ZEXT816(0xffffffff00000001),8);
  uVar42 = SUB168(auVar23 * ZEXT816(0xffffffff00000001),0);
  uVar38 = (ulong)CARRY8(uVar38,uVar1);
  uVar1 = uVar39 + uVar49;
  uVar52 = uVar1 + CARRY8(uVar43,uVar60);
  uVar1 = (ulong)(CARRY8(uVar39,uVar49) || CARRY8(uVar1,(ulong)CARRY8(uVar43,uVar60)));
  uVar49 = uVar38 + uVar42;
  uVar39 = uVar49 + uVar1;
  uVar42 = (ulong)(CARRY8(uVar38,uVar42) || CARRY8(uVar49,uVar1));
  uVar41 = uVar39 + uVar50;
  uVar1 = (ulong)CARRY8(uVar39,uVar50);
  uVar49 = uVar42 + uVar44;
  uVar38 = uVar49 + uVar1;
  uVar39 = uVar38 + uVar68;
  uVar46 = uVar43 + uVar60 + lVar71 + uVar58 + (ulong)CARRY8(uVar47,uVar51);
  uVar60 = (ulong)(byte)-((0xfffffffffffffffe < uVar46) + -1);
  uVar43 = uVar52 - uVar60;
  uVar60 = (ulong)(byte)-((-1 - (uVar52 < uVar60)) + (0xfffffffe < uVar43));
  uVar50 = (ulong)(uVar41 < uVar60);
  uVar47 = uVar39 - uVar50;
  uVar1 = -(ulong)((byte)((CARRY8(uVar42,uVar44) || CARRY8(uVar49,uVar1)) + CARRY8(uVar38,uVar68) +
                         (CARRY8(uVar45,uVar40) || CARRY8(uVar48,uVar61))) <
                  (byte)-((-1 - (uVar39 < uVar50)) + (0xffffffff00000000 < uVar47)));
  uVar61 = ~uVar1;
  *out1 = uVar46 + 1 & uVar61 | uVar46 & uVar1;
  out1[1] = uVar43 - 0xffffffff & uVar61 | uVar52 & uVar1;
  out1[2] = uVar41 - uVar60 & uVar61 | uVar41 & uVar1;
  out1[3] = uVar61 & uVar47 + 0xffffffff | uVar1 & uVar39;
  return;
}

Assistant:

static FIAT_P256_FIAT_INLINE void fiat_p256_square(fiat_p256_montgomery_domain_field_element out1, const fiat_p256_montgomery_domain_field_element arg1) {
#if !defined(OPENSSL_NO_ASM) && defined(__GNUC__) && defined(__x86_64__)
  if (CRYPTO_is_BMI1_capable() && CRYPTO_is_BMI2_capable() &&
    CRYPTO_is_ADX_capable()) {
      fiat_p256_adx_sqr(out1, arg1);
      return;
  }
#endif
  uint64_t x1;
  uint64_t x2;
  uint64_t x3;
  uint64_t x4;
  uint64_t x5;
  uint64_t x6;
  uint64_t x7;
  uint64_t x8;
  uint64_t x9;
  uint64_t x10;
  uint64_t x11;
  uint64_t x12;
  uint64_t x13;
  fiat_p256_uint1 x14;
  uint64_t x15;
  fiat_p256_uint1 x16;
  uint64_t x17;
  fiat_p256_uint1 x18;
  uint64_t x19;
  uint64_t x20;
  uint64_t x21;
  uint64_t x22;
  uint64_t x23;
  uint64_t x24;
  uint64_t x25;
  uint64_t x26;
  fiat_p256_uint1 x27;
  uint64_t x28;
  uint64_t x29;
  fiat_p256_uint1 x30;
  uint64_t x31;
  fiat_p256_uint1 x32;
  uint64_t x33;
  fiat_p256_uint1 x34;
  uint64_t x35;
  fiat_p256_uint1 x36;
  uint64_t x37;
  fiat_p256_uint1 x38;
  uint64_t x39;
  uint64_t x40;
  uint64_t x41;
  uint64_t x42;
  uint64_t x43;
  uint64_t x44;
  uint64_t x45;
  uint64_t x46;
  uint64_t x47;
  fiat_p256_uint1 x48;
  uint64_t x49;
  fiat_p256_uint1 x50;
  uint64_t x51;
  fiat_p256_uint1 x52;
  uint64_t x53;
  uint64_t x54;
  fiat_p256_uint1 x55;
  uint64_t x56;
  fiat_p256_uint1 x57;
  uint64_t x58;
  fiat_p256_uint1 x59;
  uint64_t x60;
  fiat_p256_uint1 x61;
  uint64_t x62;
  fiat_p256_uint1 x63;
  uint64_t x64;
  uint64_t x65;
  uint64_t x66;
  uint64_t x67;
  uint64_t x68;
  uint64_t x69;
  uint64_t x70;
  fiat_p256_uint1 x71;
  uint64_t x72;
  uint64_t x73;
  fiat_p256_uint1 x74;
  uint64_t x75;
  fiat_p256_uint1 x76;
  uint64_t x77;
  fiat_p256_uint1 x78;
  uint64_t x79;
  fiat_p256_uint1 x80;
  uint64_t x81;
  fiat_p256_uint1 x82;
  uint64_t x83;
  uint64_t x84;
  uint64_t x85;
  uint64_t x86;
  uint64_t x87;
  uint64_t x88;
  uint64_t x89;
  uint64_t x90;
  uint64_t x91;
  uint64_t x92;
  fiat_p256_uint1 x93;
  uint64_t x94;
  fiat_p256_uint1 x95;
  uint64_t x96;
  fiat_p256_uint1 x97;
  uint64_t x98;
  uint64_t x99;
  fiat_p256_uint1 x100;
  uint64_t x101;
  fiat_p256_uint1 x102;
  uint64_t x103;
  fiat_p256_uint1 x104;
  uint64_t x105;
  fiat_p256_uint1 x106;
  uint64_t x107;
  fiat_p256_uint1 x108;
  uint64_t x109;
  uint64_t x110;
  uint64_t x111;
  uint64_t x112;
  uint64_t x113;
  uint64_t x114;
  uint64_t x115;
  fiat_p256_uint1 x116;
  uint64_t x117;
  uint64_t x118;
  fiat_p256_uint1 x119;
  uint64_t x120;
  fiat_p256_uint1 x121;
  uint64_t x122;
  fiat_p256_uint1 x123;
  uint64_t x124;
  fiat_p256_uint1 x125;
  uint64_t x126;
  fiat_p256_uint1 x127;
  uint64_t x128;
  uint64_t x129;
  uint64_t x130;
  uint64_t x131;
  uint64_t x132;
  uint64_t x133;
  uint64_t x134;
  uint64_t x135;
  uint64_t x136;
  uint64_t x137;
  fiat_p256_uint1 x138;
  uint64_t x139;
  fiat_p256_uint1 x140;
  uint64_t x141;
  fiat_p256_uint1 x142;
  uint64_t x143;
  uint64_t x144;
  fiat_p256_uint1 x145;
  uint64_t x146;
  fiat_p256_uint1 x147;
  uint64_t x148;
  fiat_p256_uint1 x149;
  uint64_t x150;
  fiat_p256_uint1 x151;
  uint64_t x152;
  fiat_p256_uint1 x153;
  uint64_t x154;
  uint64_t x155;
  uint64_t x156;
  uint64_t x157;
  uint64_t x158;
  uint64_t x159;
  uint64_t x160;
  fiat_p256_uint1 x161;
  uint64_t x162;
  uint64_t x163;
  fiat_p256_uint1 x164;
  uint64_t x165;
  fiat_p256_uint1 x166;
  uint64_t x167;
  fiat_p256_uint1 x168;
  uint64_t x169;
  fiat_p256_uint1 x170;
  uint64_t x171;
  fiat_p256_uint1 x172;
  uint64_t x173;
  uint64_t x174;
  fiat_p256_uint1 x175;
  uint64_t x176;
  fiat_p256_uint1 x177;
  uint64_t x178;
  fiat_p256_uint1 x179;
  uint64_t x180;
  fiat_p256_uint1 x181;
  uint64_t x182;
  fiat_p256_uint1 x183;
  uint64_t x184;
  uint64_t x185;
  uint64_t x186;
  uint64_t x187;
  x1 = (arg1[1]);
  x2 = (arg1[2]);
  x3 = (arg1[3]);
  x4 = (arg1[0]);
  fiat_p256_mulx_u64(&x5, &x6, x4, (arg1[3]));
  fiat_p256_mulx_u64(&x7, &x8, x4, (arg1[2]));
  fiat_p256_mulx_u64(&x9, &x10, x4, (arg1[1]));
  fiat_p256_mulx_u64(&x11, &x12, x4, (arg1[0]));
  fiat_p256_addcarryx_u64(&x13, &x14, 0x0, x12, x9);
  fiat_p256_addcarryx_u64(&x15, &x16, x14, x10, x7);
  fiat_p256_addcarryx_u64(&x17, &x18, x16, x8, x5);
  x19 = (x18 + x6);
  fiat_p256_mulx_u64(&x20, &x21, x11, UINT64_C(0xffffffff00000001));
  fiat_p256_mulx_u64(&x22, &x23, x11, UINT32_C(0xffffffff));
  fiat_p256_mulx_u64(&x24, &x25, x11, UINT64_C(0xffffffffffffffff));
  fiat_p256_addcarryx_u64(&x26, &x27, 0x0, x25, x22);
  x28 = (x27 + x23);
  fiat_p256_addcarryx_u64(&x29, &x30, 0x0, x11, x24);
  fiat_p256_addcarryx_u64(&x31, &x32, x30, x13, x26);
  fiat_p256_addcarryx_u64(&x33, &x34, x32, x15, x28);
  fiat_p256_addcarryx_u64(&x35, &x36, x34, x17, x20);
  fiat_p256_addcarryx_u64(&x37, &x38, x36, x19, x21);
  fiat_p256_mulx_u64(&x39, &x40, x1, (arg1[3]));
  fiat_p256_mulx_u64(&x41, &x42, x1, (arg1[2]));
  fiat_p256_mulx_u64(&x43, &x44, x1, (arg1[1]));
  fiat_p256_mulx_u64(&x45, &x46, x1, (arg1[0]));
  fiat_p256_addcarryx_u64(&x47, &x48, 0x0, x46, x43);
  fiat_p256_addcarryx_u64(&x49, &x50, x48, x44, x41);
  fiat_p256_addcarryx_u64(&x51, &x52, x50, x42, x39);
  x53 = (x52 + x40);
  fiat_p256_addcarryx_u64(&x54, &x55, 0x0, x31, x45);
  fiat_p256_addcarryx_u64(&x56, &x57, x55, x33, x47);
  fiat_p256_addcarryx_u64(&x58, &x59, x57, x35, x49);
  fiat_p256_addcarryx_u64(&x60, &x61, x59, x37, x51);
  fiat_p256_addcarryx_u64(&x62, &x63, x61, x38, x53);
  fiat_p256_mulx_u64(&x64, &x65, x54, UINT64_C(0xffffffff00000001));
  fiat_p256_mulx_u64(&x66, &x67, x54, UINT32_C(0xffffffff));
  fiat_p256_mulx_u64(&x68, &x69, x54, UINT64_C(0xffffffffffffffff));
  fiat_p256_addcarryx_u64(&x70, &x71, 0x0, x69, x66);
  x72 = (x71 + x67);
  fiat_p256_addcarryx_u64(&x73, &x74, 0x0, x54, x68);
  fiat_p256_addcarryx_u64(&x75, &x76, x74, x56, x70);
  fiat_p256_addcarryx_u64(&x77, &x78, x76, x58, x72);
  fiat_p256_addcarryx_u64(&x79, &x80, x78, x60, x64);
  fiat_p256_addcarryx_u64(&x81, &x82, x80, x62, x65);
  x83 = ((uint64_t)x82 + x63);
  fiat_p256_mulx_u64(&x84, &x85, x2, (arg1[3]));
  fiat_p256_mulx_u64(&x86, &x87, x2, (arg1[2]));
  fiat_p256_mulx_u64(&x88, &x89, x2, (arg1[1]));
  fiat_p256_mulx_u64(&x90, &x91, x2, (arg1[0]));
  fiat_p256_addcarryx_u64(&x92, &x93, 0x0, x91, x88);
  fiat_p256_addcarryx_u64(&x94, &x95, x93, x89, x86);
  fiat_p256_addcarryx_u64(&x96, &x97, x95, x87, x84);
  x98 = (x97 + x85);
  fiat_p256_addcarryx_u64(&x99, &x100, 0x0, x75, x90);
  fiat_p256_addcarryx_u64(&x101, &x102, x100, x77, x92);
  fiat_p256_addcarryx_u64(&x103, &x104, x102, x79, x94);
  fiat_p256_addcarryx_u64(&x105, &x106, x104, x81, x96);
  fiat_p256_addcarryx_u64(&x107, &x108, x106, x83, x98);
  fiat_p256_mulx_u64(&x109, &x110, x99, UINT64_C(0xffffffff00000001));
  fiat_p256_mulx_u64(&x111, &x112, x99, UINT32_C(0xffffffff));
  fiat_p256_mulx_u64(&x113, &x114, x99, UINT64_C(0xffffffffffffffff));
  fiat_p256_addcarryx_u64(&x115, &x116, 0x0, x114, x111);
  x117 = (x116 + x112);
  fiat_p256_addcarryx_u64(&x118, &x119, 0x0, x99, x113);
  fiat_p256_addcarryx_u64(&x120, &x121, x119, x101, x115);
  fiat_p256_addcarryx_u64(&x122, &x123, x121, x103, x117);
  fiat_p256_addcarryx_u64(&x124, &x125, x123, x105, x109);
  fiat_p256_addcarryx_u64(&x126, &x127, x125, x107, x110);
  x128 = ((uint64_t)x127 + x108);
  fiat_p256_mulx_u64(&x129, &x130, x3, (arg1[3]));
  fiat_p256_mulx_u64(&x131, &x132, x3, (arg1[2]));
  fiat_p256_mulx_u64(&x133, &x134, x3, (arg1[1]));
  fiat_p256_mulx_u64(&x135, &x136, x3, (arg1[0]));
  fiat_p256_addcarryx_u64(&x137, &x138, 0x0, x136, x133);
  fiat_p256_addcarryx_u64(&x139, &x140, x138, x134, x131);
  fiat_p256_addcarryx_u64(&x141, &x142, x140, x132, x129);
  x143 = (x142 + x130);
  fiat_p256_addcarryx_u64(&x144, &x145, 0x0, x120, x135);
  fiat_p256_addcarryx_u64(&x146, &x147, x145, x122, x137);
  fiat_p256_addcarryx_u64(&x148, &x149, x147, x124, x139);
  fiat_p256_addcarryx_u64(&x150, &x151, x149, x126, x141);
  fiat_p256_addcarryx_u64(&x152, &x153, x151, x128, x143);
  fiat_p256_mulx_u64(&x154, &x155, x144, UINT64_C(0xffffffff00000001));
  fiat_p256_mulx_u64(&x156, &x157, x144, UINT32_C(0xffffffff));
  fiat_p256_mulx_u64(&x158, &x159, x144, UINT64_C(0xffffffffffffffff));
  fiat_p256_addcarryx_u64(&x160, &x161, 0x0, x159, x156);
  x162 = (x161 + x157);
  fiat_p256_addcarryx_u64(&x163, &x164, 0x0, x144, x158);
  fiat_p256_addcarryx_u64(&x165, &x166, x164, x146, x160);
  fiat_p256_addcarryx_u64(&x167, &x168, x166, x148, x162);
  fiat_p256_addcarryx_u64(&x169, &x170, x168, x150, x154);
  fiat_p256_addcarryx_u64(&x171, &x172, x170, x152, x155);
  x173 = ((uint64_t)x172 + x153);
  fiat_p256_subborrowx_u64(&x174, &x175, 0x0, x165, UINT64_C(0xffffffffffffffff));
  fiat_p256_subborrowx_u64(&x176, &x177, x175, x167, UINT32_C(0xffffffff));
  fiat_p256_subborrowx_u64(&x178, &x179, x177, x169, 0x0);
  fiat_p256_subborrowx_u64(&x180, &x181, x179, x171, UINT64_C(0xffffffff00000001));
  fiat_p256_subborrowx_u64(&x182, &x183, x181, x173, 0x0);
  fiat_p256_cmovznz_u64(&x184, x183, x174, x165);
  fiat_p256_cmovznz_u64(&x185, x183, x176, x167);
  fiat_p256_cmovznz_u64(&x186, x183, x178, x169);
  fiat_p256_cmovznz_u64(&x187, x183, x180, x171);
  out1[0] = x184;
  out1[1] = x185;
  out1[2] = x186;
  out1[3] = x187;
}